

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O0

bool __thiscall CumulativeCalProp::propagate(CumulativeCalProp *this)

{
  uint index;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  int *piVar5;
  long in_RDI;
  CumulativeCalProp *in_stack_00000010;
  int i_1;
  int ii_1;
  int i;
  int ii;
  int tw_end;
  int tw_begin;
  int new_unfixed;
  int in_stack_00000058;
  int in_stack_0000005c;
  int in_stack_00000060;
  int in_stack_00000064;
  CumulativeCalProp *in_stack_00000068;
  int in_stack_000000fc;
  CumulativeCalProp *in_stack_00000100;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_28;
  uint local_20;
  int local_1c;
  int local_18;
  uint local_14;
  
  local_20 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x14));
  local_18 = *(int *)(in_RDI + 0xac);
  local_1c = *(int *)(in_RDI + 0xa8);
  local_14 = local_20;
  do {
    if ((int)local_20 < 0) {
      local_18 = *(int *)(in_RDI + 0xa8);
      local_1c = *(int *)(in_RDI + 0xac);
      Tint::operator=((Tint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (int)((ulong)in_RDI >> 0x20));
      do {
        *(undefined1 *)(in_RDI + 0x110) = 0;
        *(undefined4 *)(in_RDI + 0x158) = 0;
        if ((((*(byte *)(in_RDI + 0xb1) & 1) != 0) || ((*(byte *)(in_RDI + 0xb2) & 1) != 0)) &&
           (bVar1 = time_table_propagation
                              (in_stack_00000068,
                               (vec<int> *)CONCAT44(in_stack_00000064,in_stack_00000060),
                               in_stack_0000005c,in_stack_00000058), !bVar1)) {
          return false;
        }
        if (((((*(byte *)(in_RDI + 0x110) & 1) == 0) &&
             (iVar2 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x14)), 0 < iVar2)) &&
            (((*(byte *)(in_RDI + 0xb3) & 1) != 0 || ((*(byte *)(in_RDI + 0xb4) & 1) != 0)))) &&
           ((*(long *)(in_RDI + 0xe8) = *(long *)(in_RDI + 0xe8) + 1, *(long *)(in_RDI + 0xb8) == 0
            || (*(long *)(in_RDI + 0xe8) % *(long *)(in_RDI + 0xb8) == 0)))) {
          for (local_28 = 0; iVar2 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x14)),
              (int)local_28 <= iVar2; local_28 = local_28 + 1) {
            vec<int>::operator[]((vec<int> *)(in_RDI + 0x118),local_28);
            retrieveEnergyParameters
                      ((CumulativeCalProp *)
                       CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
          }
          ttef_initialise_parameters(in_stack_00000010);
          if ((*(byte *)(in_RDI + 0xb4) & 1) == 0) {
            bVar1 = ttef_consistency_check(in_stack_00000100,in_stack_000000fc);
            if (!bVar1) {
              return false;
            }
          }
          else {
            bVar1 = ttef_bounds_propagation(in_stack_00000068,in_stack_00000064,in_stack_00000060);
            if (!bVar1) {
              return false;
            }
          }
        }
        in_stack_ffffffffffffffb7 = 0;
        if ((*(byte *)(in_RDI + 0xb0) & 1) != 0) {
          in_stack_ffffffffffffffb7 = *(byte *)(in_RDI + 0x110);
        }
      } while ((in_stack_ffffffffffffffb7 & 1) != 0);
      return true;
    }
    puVar4 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x118),local_20);
    index = *puVar4;
    iVar2 = min_dur((CumulativeCalProp *)
                    CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
    if ((0 < iVar2) &&
       (iVar2 = min_usage((CumulativeCalProp *)
                          CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac), 0 < iVar2)) {
      retrieveCoreParameters
                ((CumulativeCalProp *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    }
    piVar5 = std::min<int>(&local_18,(int *)(*(long *)(in_RDI + 0x168) + (long)(int)index * 4));
    local_18 = *piVar5;
    piVar5 = std::max<int>(&local_1c,(int *)(*(long *)(in_RDI + 0x180) + (long)(int)index * 4));
    local_1c = *piVar5;
    vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x38),index);
    bVar1 = IntVar::isFixed((IntVar *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0))
    ;
    if (bVar1) {
      vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x48),index);
      bVar1 = IntVar::isFixed((IntVar *)
                              CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      if (!bVar1) goto LAB_001cc4be;
      vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x58),index);
      bVar1 = IntVar::isFixed((IntVar *)
                              CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      if (!bVar1) goto LAB_001cc4be;
LAB_001cc4e8:
      piVar5 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x118),local_14);
      iVar2 = *piVar5;
      piVar5 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x118),local_20);
      *piVar5 = iVar2;
      puVar4 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x118),local_14);
      *puVar4 = index;
      local_14 = local_14 - 1;
      if ((*(long *)(in_RDI + 0x188) != 0) &&
         ((iVar2 = min_dur((CumulativeCalProp *)
                           CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffac), 0 < iVar2 &&
          (iVar2 = min_usage((CumulativeCalProp *)
                             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffac), 0 < iVar2)))) {
        *(undefined4 *)(*(long *)(in_RDI + 0x198) + (long)(int)index * 4) = 0;
        if (*(int *)(in_RDI + 0x90) == 1) {
          iVar2 = min_usage((CumulativeCalProp *)
                            CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac);
          *(int *)(*(long *)(in_RDI + 0x188) + (long)(int)index * 4) =
               iVar2 * (*(int *)(*(long *)(in_RDI + 0x180) + (long)(int)index * 4) -
                       *(int *)(*(long *)(in_RDI + 0x168) + (long)(int)index * 4));
        }
        else {
          iVar2 = min_usage((CumulativeCalProp *)
                            CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac);
          iVar3 = min_dur((CumulativeCalProp *)
                          CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
          *(int *)(*(long *)(in_RDI + 0x188) + (long)(int)index * 4) = iVar2 * iVar3;
        }
      }
    }
    else {
LAB_001cc4be:
      iVar2 = max_dur((CumulativeCalProp *)
                      CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
      if ((iVar2 < 1) ||
         (iVar2 = max_usage((CumulativeCalProp *)
                            CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac), iVar2 < 1)) goto LAB_001cc4e8;
    }
    local_20 = local_20 - 1;
  } while( true );
}

Assistant:

CUMU_BOOL
	propagate() override {
#if CUMUVERB > 1
		fprintf(stderr, "Entering cumulative propagation\n");
#endif
		assert(last_unfixed >= 0);
		// Retrieval of the task's core data and updating
		// the fixed-task array
		int new_unfixed = last_unfixed;
		int tw_begin = maxTime;
		int tw_end = minTime;
		for (int ii = new_unfixed; ii >= 0; ii--) {
			const int i = task_id[ii];
			// Retrieve core data (est, lst, ect, lct)
			if (min_dur(i) > 0 && min_usage(i) > 0) {
				retrieveCoreParameters(i);
			}
			// Compute the time window for consideration
			tw_begin = std::min(tw_begin, est_2[i]);
			tw_end = std::max(tw_end, lct_2[i]);
			// Check whether the task 'i' is fixed
			if ((CUMU_PT_ISFIXED(start[i]) && CUMU_PT_ISFIXED(dur[i]) && CUMU_PT_ISFIXED(usage[i])) ||
					max_dur(i) <= 0 || max_usage(i) <= 0) {
				// Swapping the id's
				task_id[ii] = task_id[new_unfixed];
				task_id[new_unfixed] = i;
				new_unfixed--;
				if (min_energy2 != nullptr && min_dur(i) > 0 && min_usage(i) > 0) {
					free_energy2[i] = 0;
					if (rho == 1) {
						// Resource stays engaged
						min_energy2[i] = min_usage(i) * (lct_2[i] - est_2[i]);
					} else {
						// Resource is released
						min_energy2[i] = min_usage(i) * min_dur(i);
					}
				}
			}
		}
		tw_begin = minTime;
		tw_end = maxTime;
		// Trailing the index of the last unfixed task
		last_unfixed = new_unfixed;
#if CUMUVERB > 1
		fprintf(stderr, "\tEntering cumulative propagation loop\n");
#endif
		// idempotent
		do {
			bound_update = false;
			// Resetting the profile size
			tt_profile_size = 0;
			// Time-table propagators
			if (tt_check || tt_filt) {
				// Time-table propagation
				if (!time_table_propagation(task_id, tw_begin, tw_end)) {
					// Inconsistency was detected
#if CUMUVERB > 1
					fprintf(stderr, "Leaving cumulative propagation with failure\n");
#endif
					return false;
				}
			}
			// if (!bound_update)
			//	nb_prop_calls++;
			//  Time-table-edge-finding propagation
			if (!bound_update && last_unfixed > 0 &&
					(ttef_check || ttef_filt)) {  // && nb_prop_calls % 100 == 0) {
				nb_prop_calls++;
				if (ttef_prop_factor != 0 && nb_prop_calls % ttef_prop_factor != 0) {
					continue;
				}
#if CUMUVERB > 0
				fprintf(stderr, "Entering TTEF\n");
#endif
				// Retrieval of the data required for the TTEF propagation
				for (int ii = 0; ii <= last_unfixed; ii++) {
					const int i = task_id[ii];
					retrieveEnergyParameters(i);
				}
				// Initialisation of necessary structures
				// - Unfixed tasks sorted according earliest start time
				// - Unfixed tasks sorted according latest completion time
				// - Energy of the compulsory parts after the latest completion
				// 	 time of unfixed tasks
				// - Energy of the compulsory parts after the earliest start
				//   time of unfixed tasks
				ttef_initialise_parameters();

				// TTEF filtering algorithm
				if (ttef_filt) {
					if (!ttef_bounds_propagation(1, 2)) {
						// Inconsistency was detected
						return false;
					}
				} else {
#if CUMUVERB > 0
					fprintf(stderr, "Entering TTEF Consistency\n");
#endif
					if (!ttef_consistency_check(1)) {
						// Inconsistency was detected
						return false;
					}
#if CUMUVERB > 0
					fprintf(stderr, "Leaving TTEF Consistency\n");
#endif
				}
#if CUMUVERB > 0
				fprintf(stderr, "Leaving TTEF\n");
#endif
			}
		} while (idem && bound_update);
#if CUMUVERB > 0
		fprintf(stderr, "\tLeaving cumulative propagation loop\n");
		fprintf(stderr, "Leaving cumulative propagation without failure\n");
#endif
		return true;
	}